

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::StringFormatTask::~StringFormatTask(StringFormatTask *this)

{
  SystemSubroutine::~SystemSubroutine((SystemSubroutine *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

explicit StringFormatTask(KnownSystemName knownNameId) : SystemTaskBase(knownNameId) {
        hasOutputArgs = true;
    }